

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::SingleArena_ConstructEmptyWithDefault_Test::TestBody
          (SingleArena_ConstructEmptyWithDefault_Test *this)

{
  bool bVar1;
  pointer arena_00;
  string *lhs;
  char *pcVar2;
  char *in_R9;
  string local_c8;
  AssertHelper local_a8;
  Message local_a0;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  ArenaStringPtr local_50;
  ArenaStringPtr field;
  LazyString default_value;
  unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> arena;
  SingleArena_ConstructEmptyWithDefault_Test *this_local;
  
  arena._M_t.
  super___uniq_ptr_impl<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>._M_t
  .super__Tuple_impl<0UL,_google::protobuf::Arena_*,_std::default_delete<google::protobuf::Arena>_>.
  super__Head_base<0UL,_google::protobuf::Arena_*,_false>._M_head_impl =
       (__uniq_ptr_data<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>,_true,_true>
        )(__uniq_ptr_data<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>,_true,_true>
          )this;
  SingleArena::GetArena((SingleArena *)&stack0xffffffffffffffe8);
  field.tagged_ptr_.ptr_ = (TaggedStringPtr)anon_var_dwarf_a7e2b;
  arena_00 = std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
             ::get((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
                    *)&stack0xffffffffffffffe8);
  internal::ArenaStringPtr::ArenaStringPtr(&local_50,arena_00,(LazyString *)&field);
  lhs = internal::ArenaStringPtr::Get_abi_cxx11_(&local_50);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[1],_nullptr>
            ((EqHelper *)local_70,"field.Get()","\"\"",lhs,(char (*) [1])(anon_var_dwarf_37cdd0 + 5)
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  local_91 = internal::ArenaStringPtr::IsDefault(&local_50);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_90,&local_91,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_90,(AssertionResult *)"field.IsDefault()","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring_unittest.cc"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  bVar1 = std::operator==((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>
                           *)&stack0xffffffffffffffe8,(nullptr_t)0x0);
  if (bVar1) {
    internal::ArenaStringPtr::Destroy(&local_50);
  }
  std::unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_>::
  ~unique_ptr((unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> *)
              &stack0xffffffffffffffe8);
  return;
}

Assistant:

TEST_P(SingleArena, ConstructEmptyWithDefault) {
  auto arena = GetArena();
  internal::LazyString default_value{{{"Hello default", 13}}, {nullptr}};
  ArenaStringPtr field(arena.get(), default_value);

  if (internal::DebugHardenForceCopyDefaultString()) {
    EXPECT_EQ(field.Get(), "Hello default");
    EXPECT_FALSE(field.IsDefault());
  } else {
    EXPECT_EQ(field.Get(), "");
    EXPECT_TRUE(field.IsDefault());
  }
  if (arena == nullptr) field.Destroy();
}